

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

bool __thiscall FMapInfoParser::CheckNumber(FMapInfoParser *this)

{
  bool bVar1;
  
  if (this->format_type != 2) {
    bVar1 = FScanner::CheckNumber(&this->sc);
    return bVar1;
  }
  bVar1 = FScanner::CheckString(&this->sc,",");
  if (bVar1) {
    FScanner::MustGetNumber(&this->sc);
  }
  return bVar1;
}

Assistant:

bool FMapInfoParser::CheckNumber()
{
	if (format_type == FMT_New) 
	{
		if (sc.CheckString(","))
		{
			sc.MustGetNumber();
			return true;
		}
		return false;
	}
	else return sc.CheckNumber();
}